

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  ImDrawListFlags *pIVar1;
  ImDrawList *pIVar2;
  float *pfVar3;
  ImGuiNavMoveResult *pIVar4;
  bool *pbVar5;
  int *piVar6;
  ImGuiNextWindowData *pIVar7;
  ImVec2 *pIVar8;
  float fVar9;
  ImGuiID IVar10;
  ImGuiInputSource IVar11;
  ImGuiID IVar12;
  ImFontAtlas *pIVar13;
  ImGuiWindow **ppIVar14;
  ImGuiPopupData *pIVar15;
  ImGuiContext *pIVar16;
  ImGuiContext *pIVar17;
  ImGuiContext *pIVar18;
  ImGuiContext *pIVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  int i;
  int iVar23;
  int iVar24;
  long lVar25;
  ImGuiWindow *pIVar26;
  ImGuiWindow **__dest;
  ImGuiPopupData *__dest_00;
  int i_1;
  ImGuiWindow *window_00;
  char *pcVar27;
  ImGuiWindow *parent_window;
  ImGuiWindow *pIVar28;
  ulong uVar29;
  ImGuiContext *g_4;
  ImGuiNavMoveResult *pIVar30;
  float *pfVar31;
  ulong uVar32;
  ImGuiNavLayer IVar33;
  ImFont *font;
  float *pfVar34;
  ImGuiContext *g;
  ImGuiContext *g_1;
  byte bVar35;
  ImGuiWindow *window;
  bool bVar36;
  byte bVar37;
  uint uVar38;
  uint uVar39;
  float fVar40;
  float fVar41;
  ImVec2 IVar42;
  ImVec2 IVar43;
  ImVec2 IVar44;
  double dVar45;
  ImVec2 IVar46;
  ImVec2 IVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  ImVec2 IVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  ImRect rect_abs;
  ImRect local_68;
  undefined1 local_58 [16];
  ImRect local_40;
  
  pIVar16 = GImGui;
  bVar37 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe3d,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe25,"void NewFrameSanityChecks()");
  }
  if (((GImGui->IO).DeltaTime <= 0.0) && (GImGui->FrameCount != 0)) {
    __assert_fail("(g.IO.DeltaTime > 0.0f || g.FrameCount == 0) && \"Need a positive DeltaTime!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe26,"void NewFrameSanityChecks()");
  }
  if ((GImGui->FrameCount != 0) && (GImGui->FrameCountEnded != GImGui->FrameCount)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe27,"void NewFrameSanityChecks()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe28,"void NewFrameSanityChecks()");
  }
  pIVar13 = (GImGui->IO).Fonts;
  if ((pIVar13->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe29,"void NewFrameSanityChecks()");
  }
  if ((*(pIVar13->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe2a,"void NewFrameSanityChecks()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting!\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe2b,"void NewFrameSanityChecks()");
  }
  fVar40 = (GImGui->Style).Alpha;
  if ((fVar40 < 0.0) || (1.0 < fVar40)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe2c,"void NewFrameSanityChecks()");
  }
  if (((GImGui->Style).WindowMinSize.x < 1.0) || ((GImGui->Style).WindowMinSize.y < 1.0)) {
    __assert_fail("g.Style.WindowMinSize.x >= 1.0f && g.Style.WindowMinSize.y >= 1.0f && \"Invalid style setting.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe2d,"void NewFrameSanityChecks()");
  }
  if (1 < (uint)(GImGui->Style).WindowMenuButtonPosition) {
    __assert_fail("g.Style.WindowMenuButtonPosition == ImGuiDir_Left || g.Style.WindowMenuButtonPosition == ImGuiDir_Right"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe2e,"void NewFrameSanityChecks()");
  }
  lVar25 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar25] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown)/sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0xe30,"void NewFrameSanityChecks()");
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x16);
  if ((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe34,"void NewFrameSanityChecks()");
  }
  if (((GImGui->IO).ConfigWindowsResizeFromEdges == true) && (((GImGui->IO).BackendFlags & 2) == 0))
  {
    (GImGui->IO).ConfigWindowsResizeFromEdges = false;
  }
  if (pIVar16->SettingsLoaded == false) {
    if ((pIVar16->SettingsWindows).Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0xe4a,"void ImGui::NewFrame()");
    }
    pcVar27 = (pIVar16->IO).IniFilename;
    if (pcVar27 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar27);
    }
    pIVar16->SettingsLoaded = true;
  }
  if ((0.0 < pIVar16->SettingsDirtyTimer) &&
     (fVar40 = pIVar16->SettingsDirtyTimer - (pIVar16->IO).DeltaTime,
     pIVar16->SettingsDirtyTimer = fVar40, fVar40 <= 0.0)) {
    pcVar27 = (pIVar16->IO).IniFilename;
    if (pcVar27 == (char *)0x0) {
      (pIVar16->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar27);
    }
    pIVar16->SettingsDirtyTimer = 0.0;
  }
  pIVar16->Time = (double)(pIVar16->IO).DeltaTime + pIVar16->Time;
  pIVar16->FrameScopeActive = true;
  pIVar16->FrameCount = pIVar16->FrameCount + 1;
  pIVar16->TooltipOverrideCount = 0;
  pIVar16->WindowsActiveCount = 0;
  ((pIVar16->IO).Fonts)->Locked = true;
  font = (GImGui->IO).FontDefault;
  if (font == (ImFont *)0x0) {
    pIVar13 = (GImGui->IO).Fonts;
    if ((pIVar13->Fonts).Size < 1) {
      pcVar27 = "T &ImVector<ImFont *>::operator[](int) [T = ImFont *]";
LAB_0013ed45:
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.h"
                    ,0x4d8,pcVar27);
    }
    font = *(pIVar13->Fonts).Data;
  }
  SetCurrentFont(font);
  if (pIVar16->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xe67,"void ImGui::NewFrame()");
  }
  fVar40 = (pIVar16->IO).DisplaySize.x;
  fVar49 = (pIVar16->IO).DisplaySize.y;
  (pIVar16->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar16->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar16->DrawListSharedData).ClipRectFullscreen.z = fVar40;
  (pIVar16->DrawListSharedData).ClipRectFullscreen.w = fVar49;
  (pIVar16->DrawListSharedData).CurveTessellationTol = (pIVar16->Style).CurveTessellationTol;
  uVar38 = (uint)(pIVar16->Style).AntiAliasedLines;
  (pIVar16->DrawListSharedData).InitialFlags = uVar38;
  if ((pIVar16->Style).AntiAliasedFill == true) {
    (pIVar16->DrawListSharedData).InitialFlags = uVar38 | 2;
  }
  if (((pIVar16->IO).BackendFlags & 8) != 0) {
    pIVar1 = &(pIVar16->DrawListSharedData).InitialFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  pIVar2 = &pIVar16->BackgroundDrawList;
  ImDrawList::Clear(pIVar2);
  ImDrawList::PushTextureID(pIVar2,((pIVar16->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar2);
  pIVar2 = &pIVar16->ForegroundDrawList;
  ImDrawList::Clear(pIVar2);
  ImDrawList::PushTextureID(pIVar2,((pIVar16->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(pIVar2);
  (pIVar16->DrawData).Valid = false;
  (pIVar16->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar16->DrawData).CmdListsCount = 0;
  (pIVar16->DrawData).TotalIdxCount = 0;
  (pIVar16->DrawData).TotalVtxCount = 0;
  (pIVar16->DrawData).DisplayPos.x = 0.0;
  *(undefined8 *)&(pIVar16->DrawData).DisplayPos.y = 0;
  (pIVar16->DrawData).DisplaySize.x = 0.0;
  (pIVar16->DrawData).DisplaySize.y = 0.0;
  (pIVar16->DrawData).FramebufferScale.x = 0.0;
  pIVar17 = GImGui;
  (pIVar16->DrawData).FramebufferScale.y = 0.0;
  if ((pIVar16->DragDropActive == true) &&
     (IVar10 = (pIVar16->DragDropPayload).SourceId, IVar10 == pIVar16->ActiveId)) {
    if (GImGui->ActiveId == IVar10) {
      GImGui->ActiveIdIsAlive = IVar10;
    }
    if (pIVar17->ActiveIdPreviousFrame == IVar10) {
      pIVar17->ActiveIdPreviousFrameIsAlive = true;
    }
  }
  if (pIVar16->HoveredIdPreviousFrame == 0) {
    pIVar16->HoveredIdTimer = 0.0;
LAB_0013c36f:
    pIVar16->HoveredIdNotActiveTimer = 0.0;
  }
  else if ((pIVar16->HoveredId != 0) && (pIVar16->ActiveId == pIVar16->HoveredId))
  goto LAB_0013c36f;
  IVar10 = pIVar16->HoveredId;
  if ((IVar10 != 0) &&
     (pIVar16->HoveredIdTimer = (pIVar16->IO).DeltaTime + pIVar16->HoveredIdTimer,
     pIVar16->ActiveId != IVar10)) {
    pIVar16->HoveredIdNotActiveTimer = (pIVar16->IO).DeltaTime + pIVar16->HoveredIdNotActiveTimer;
  }
  pIVar16->HoveredIdPreviousFrame = IVar10;
  pIVar16->HoveredId = 0;
  pIVar16->HoveredIdAllowOverlap = false;
  pIVar17 = GImGui;
  IVar10 = pIVar16->ActiveId;
  if (((pIVar16->ActiveIdIsAlive != IVar10) && (IVar10 != 0)) &&
     (pIVar16->ActiveIdPreviousFrame == IVar10)) {
    bVar36 = GImGui->ActiveId != 0;
    GImGui->ActiveIdIsJustActivated = bVar36;
    if (bVar36) {
      pIVar17->ActiveIdTimer = 0.0;
      pIVar17->ActiveIdHasBeenPressedBefore = false;
      pIVar17->ActiveIdHasBeenEditedBefore = false;
    }
    pIVar17->ActiveId = 0;
    pIVar17->ActiveIdAllowNavDirFlags = 0;
    pIVar17->ActiveIdBlockNavInputFlags = 0;
    pIVar17->ActiveIdAllowOverlap = false;
    pIVar17->ActiveIdWindow = (ImGuiWindow *)0x0;
    pIVar17->ActiveIdHasBeenEditedThisFrame = false;
  }
  IVar10 = pIVar16->ActiveId;
  if (IVar10 != 0) {
    pIVar16->ActiveIdTimer = (pIVar16->IO).DeltaTime + pIVar16->ActiveIdTimer;
  }
  pIVar16->LastActiveIdTimer = (pIVar16->IO).DeltaTime + pIVar16->LastActiveIdTimer;
  pIVar16->ActiveIdPreviousFrame = IVar10;
  pIVar16->ActiveIdPreviousFrameWindow = pIVar16->ActiveIdWindow;
  pIVar16->ActiveIdPreviousFrameHasBeenEditedBefore = pIVar16->ActiveIdHasBeenEditedBefore;
  pIVar16->ActiveIdIsAlive = 0;
  pIVar16->ActiveIdHasBeenEditedThisFrame = false;
  pIVar16->ActiveIdPreviousFrameIsAlive = false;
  pIVar16->ActiveIdIsJustActivated = false;
  if (IVar10 != pIVar16->TempInputTextId && pIVar16->TempInputTextId != 0) {
    pIVar16->TempInputTextId = 0;
  }
  pIVar16->DragDropAcceptIdPrev = pIVar16->DragDropAcceptIdCurr;
  pIVar16->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar16->DragDropAcceptIdCurr = 0;
  pIVar16->DragDropWithinSourceOrTarget = false;
  pfVar3 = (pIVar16->IO).KeysDownDuration;
  memcpy((pIVar16->IO).KeysDownDurationPrev,pfVar3,0x800);
  lVar25 = 0;
  do {
    fVar40 = -1.0;
    if ((pIVar16->IO).KeysDown[lVar25] == true) {
      fVar40 = 0.0;
      if (0.0 <= pfVar3[lVar25]) {
        fVar40 = pfVar3[lVar25] + (pIVar16->IO).DeltaTime;
      }
    }
    pfVar3[lVar25] = fVar40;
    pIVar17 = GImGui;
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x200);
  (GImGui->IO).WantSetMousePos = false;
  uVar38 = (pIVar17->IO).ConfigFlags;
  if ((uVar38 & 2) == 0) {
    bVar35 = 0;
  }
  else {
    bVar35 = (byte)(pIVar17->IO).BackendFlags & 1;
  }
  if ((bVar35 != 0) &&
     (((0.0 < (pIVar17->IO).NavInputs[0] || (0.0 < (pIVar17->IO).NavInputs[2])) ||
      ((0.0 < (pIVar17->IO).NavInputs[1] || (0.0 < (pIVar17->IO).NavInputs[3])))))) {
    pIVar17->NavInputSource = ImGuiInputSource_NavGamepad;
  }
  if ((uVar38 & 1) != 0) {
    iVar24 = (pIVar17->IO).KeyMap[0xc];
    if (-1 < (long)iVar24) {
      if (0x1ff < iVar24) goto LAB_0013ed4f;
      if ((pIVar17->IO).KeysDown[iVar24] == true) {
        (pIVar17->IO).NavInputs[0] = 1.0;
        pIVar17->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar24 = (pIVar17->IO).KeyMap[0xd];
    if (-1 < (long)iVar24) {
      if (0x1ff < iVar24) goto LAB_0013ed4f;
      if ((pIVar17->IO).KeysDown[iVar24] == true) {
        (pIVar17->IO).NavInputs[2] = 1.0;
        pIVar17->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar24 = (pIVar17->IO).KeyMap[0xe];
    if (-1 < (long)iVar24) {
      if (0x1ff < iVar24) goto LAB_0013ed4f;
      if ((pIVar17->IO).KeysDown[iVar24] == true) {
        (pIVar17->IO).NavInputs[1] = 1.0;
        pIVar17->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar24 = (pIVar17->IO).KeyMap[1];
    if (-1 < (long)iVar24) {
      if (0x1ff < iVar24) goto LAB_0013ed4f;
      if ((pIVar17->IO).KeysDown[iVar24] == true) {
        (pIVar17->IO).NavInputs[0x12] = 1.0;
        pIVar17->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar24 = (pIVar17->IO).KeyMap[2];
    if (-1 < (long)iVar24) {
      if (0x1ff < iVar24) goto LAB_0013ed4f;
      if ((pIVar17->IO).KeysDown[iVar24] == true) {
        (pIVar17->IO).NavInputs[0x13] = 1.0;
        pIVar17->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar24 = (pIVar17->IO).KeyMap[3];
    if (-1 < (long)iVar24) {
      if (0x1ff < iVar24) goto LAB_0013ed4f;
      if ((pIVar17->IO).KeysDown[iVar24] == true) {
        (pIVar17->IO).NavInputs[0x14] = 1.0;
        pIVar17->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar24 = (pIVar17->IO).KeyMap[4];
    if (-1 < (long)iVar24) {
      if (0x1ff < iVar24) goto LAB_0013ed4f;
      if ((pIVar17->IO).KeysDown[iVar24] == true) {
        (pIVar17->IO).NavInputs[0x15] = 1.0;
        pIVar17->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar24 = (pIVar17->IO).KeyMap[0];
    if (-1 < (long)iVar24) {
      if (0x1ff < iVar24) {
LAB_0013ed4f:
        __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(GImGui->IO.KeysDown)/sizeof(*GImGui->IO.KeysDown)))"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                      ,0x10f5,"bool ImGui::IsKeyDown(int)");
      }
      if ((pIVar17->IO).KeysDown[iVar24] == true) {
        (pIVar17->IO).NavInputs[0x11] = 1.0;
        pIVar17->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    bVar36 = (pIVar17->IO).KeyCtrl;
    if (bVar36 == true) {
      (pIVar17->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar17->IO).KeyShift == true) {
      (pIVar17->IO).NavInputs[0xf] = 1.0;
    }
    if ((bVar36 == false) && ((pIVar17->IO).KeyAlt != false)) {
      (pIVar17->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar3 = (pIVar17->IO).NavInputsDownDuration;
  pfVar31 = pfVar3;
  pfVar34 = (pIVar17->IO).NavInputsDownDurationPrev;
  for (lVar25 = 0xb; lVar25 != 0; lVar25 = lVar25 + -1) {
    *(undefined8 *)pfVar34 = *(undefined8 *)pfVar31;
    pfVar31 = pfVar31 + (ulong)bVar37 * -4 + 2;
    pfVar34 = pfVar34 + (ulong)bVar37 * -4 + 2;
  }
  lVar25 = 0;
  do {
    fVar40 = -1.0;
    if (0.0 < (pIVar17->IO).NavInputs[lVar25]) {
      fVar40 = 0.0;
      if (0.0 <= pfVar3[lVar25]) {
        fVar40 = pfVar3[lVar25] + (pIVar17->IO).DeltaTime;
      }
    }
    pfVar3[lVar25] = fVar40;
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0x16);
  IVar10 = pIVar17->NavInitResultId;
  if ((IVar10 != 0) &&
     (((pIVar17->NavDisableHighlight != true || (pIVar17->NavInitRequestFromMove == true)) &&
      (pIVar17->NavWindow != (ImGuiWindow *)0x0)))) {
    IVar33 = pIVar17->NavLayer;
    if (pIVar17->NavInitRequestFromMove == true) {
      SetNavID(IVar10,IVar33);
      IVar42 = (pIVar17->NavInitResultRectRel).Max;
      pIVar8 = &pIVar17->NavWindow->NavRectRel[(int)IVar33].Min;
      *pIVar8 = (pIVar17->NavInitResultRectRel).Min;
      pIVar8[1] = IVar42;
      pIVar17->NavMousePosDirty = true;
      pIVar17->NavDisableHighlight = false;
      pIVar17->NavDisableMouseHover = true;
    }
    else {
      SetNavID(IVar10,IVar33);
    }
    IVar42 = (pIVar17->NavInitResultRectRel).Max;
    pIVar8 = &pIVar17->NavWindow->NavRectRel[pIVar17->NavLayer].Min;
    *pIVar8 = (pIVar17->NavInitResultRectRel).Min;
    pIVar8[1] = IVar42;
  }
  pIVar17->NavInitRequest = false;
  pIVar17->NavInitRequestFromMove = false;
  pIVar17->NavInitResultId = 0;
  pIVar17->NavJustMovedToId = 0;
  pIVar19 = GImGui;
  if (pIVar17->NavMoveRequest == true) {
    IVar10 = (GImGui->NavMoveResultLocal).ID;
    if ((IVar10 == 0) && ((GImGui->NavMoveResultOther).ID == 0)) {
      if (GImGui->NavId != 0) {
        pIVar19->NavDisableHighlight = false;
        pIVar19->NavDisableMouseHover = true;
      }
    }
    else {
      local_58._0_4_ = uVar38;
      pIVar4 = &GImGui->NavMoveResultOther;
      pIVar30 = &GImGui->NavMoveResultLocal;
      if (IVar10 == 0) {
        pIVar30 = pIVar4;
      }
      if ((((GImGui->NavMoveRequestFlags & 0x20) != 0) &&
          (IVar10 = (GImGui->NavMoveResultLocalVisibleSet).ID, IVar10 != 0)) &&
         (IVar10 != GImGui->NavId)) {
        pIVar30 = &GImGui->NavMoveResultLocalVisibleSet;
      }
      if (((pIVar30 != pIVar4) && (pIVar4->ID != 0)) &&
         (((GImGui->NavMoveResultOther).Window)->ParentWindow == GImGui->NavWindow)) {
        fVar40 = (GImGui->NavMoveResultOther).DistBox;
        fVar49 = pIVar30->DistBox;
        if (fVar49 <= fVar40) {
          if (((fVar40 != fVar49) || (NAN(fVar40) || NAN(fVar49))) ||
             (pfVar3 = &(GImGui->NavMoveResultOther).DistCenter,
             pIVar30->DistCenter < *pfVar3 || pIVar30->DistCenter == *pfVar3)) goto LAB_0013c9ca;
        }
        pIVar30 = pIVar4;
      }
LAB_0013c9ca:
      if ((GImGui->NavWindow == (ImGuiWindow *)0x0) || (pIVar30->Window == (ImGuiWindow *)0x0)) {
        __assert_fail("g.NavWindow && result->Window",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                      ,0x2113,"void ImGui::NavUpdateMoveResult()");
      }
      if (GImGui->NavLayer == ImGuiNavLayer_Main) {
        fVar40 = (pIVar30->Window->Pos).x;
        fVar49 = (pIVar30->Window->Pos).y;
        local_68.Min.x = (pIVar30->RectRel).Min.x + fVar40;
        local_68.Max.x = fVar40 + (pIVar30->RectRel).Max.x;
        local_68.Min.y = (pIVar30->RectRel).Min.y + fVar49;
        local_68.Max.y = fVar49 + (pIVar30->RectRel).Max.y;
        NavScrollToBringItemIntoView(pIVar30->Window,&local_68);
        pIVar26 = pIVar30->Window;
        IVar42 = CalcNextScrollFromScrollTargetAndClamp(pIVar26,false);
        fVar40 = (pIVar26->Scroll).x - IVar42.x;
        fVar49 = (pIVar26->Scroll).y - IVar42.y;
        (pIVar30->RectRel).Min.x = (pIVar30->RectRel).Min.x + fVar40;
        (pIVar30->RectRel).Min.y = (pIVar30->RectRel).Min.y + fVar49;
        (pIVar30->RectRel).Max.x = (pIVar30->RectRel).Max.x + fVar40;
        (pIVar30->RectRel).Max.y = (pIVar30->RectRel).Max.y + fVar49;
        if ((pIVar26->Flags & 0x1000000) != 0) {
          local_40.Min.x = local_68.Min.x + fVar40;
          local_40.Min.y = local_68.Min.y + fVar49;
          local_40.Max.y = fVar49 + local_68.Max.y;
          local_40.Max.x = fVar40 + local_68.Max.x;
          NavScrollToBringItemIntoView(pIVar26->ParentWindow,&local_40);
        }
      }
      pIVar18 = GImGui;
      bVar36 = GImGui->ActiveId != 0;
      GImGui->ActiveIdIsJustActivated = bVar36;
      if (bVar36) {
        pIVar18->ActiveIdTimer = 0.0;
        pIVar18->ActiveIdHasBeenPressedBefore = false;
        pIVar18->ActiveIdHasBeenEditedBefore = false;
      }
      pIVar18->ActiveId = 0;
      pIVar18->ActiveIdAllowNavDirFlags = 0;
      pIVar18->ActiveIdBlockNavInputFlags = 0;
      pIVar18->ActiveIdAllowOverlap = false;
      pIVar18->ActiveIdWindow = (ImGuiWindow *)0x0;
      pIVar18->ActiveIdHasBeenEditedThisFrame = false;
      pIVar19->NavWindow = pIVar30->Window;
      IVar10 = pIVar30->ID;
      if (pIVar19->NavId != IVar10) {
        pIVar19->NavJustMovedToId = IVar10;
        pIVar19->NavJustMovedToMultiSelectScopeId = pIVar30->SelectScopeId;
      }
      IVar33 = pIVar19->NavLayer;
      SetNavID(IVar10,IVar33);
      IVar42 = (pIVar30->RectRel).Max;
      pIVar8 = &pIVar18->NavWindow->NavRectRel[(int)IVar33].Min;
      *pIVar8 = (pIVar30->RectRel).Min;
      pIVar8[1] = IVar42;
      pIVar18->NavMousePosDirty = true;
      pIVar18->NavDisableHighlight = false;
      pIVar18->NavDisableMouseHover = true;
      pIVar19->NavMoveFromClampedRefRect = false;
      uVar38 = local_58._0_4_;
    }
  }
  if (pIVar17->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar17->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0x2022,"void ImGui::NavUpdate()");
    }
    if (((pIVar17->NavMoveResultLocal).ID == 0) && ((pIVar17->NavMoveResultOther).ID == 0)) {
      pIVar17->NavDisableHighlight = false;
    }
    pIVar17->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar17->NavMousePosDirty == true) && (pIVar17->NavIdIsAlive == true)) {
    if ((((pIVar17->IO).ConfigFlags & 4) != 0) &&
       ((((((pIVar17->IO).BackendFlags & 4) != 0 && (pIVar17->NavDisableHighlight == false)) &&
         (pIVar17->NavDisableMouseHover == true)) && (pIVar17->NavWindow != (ImGuiWindow *)0x0)))) {
      IVar42 = NavCalcPreferredRefPos();
      (pIVar17->IO).MousePosPrev = IVar42;
      (pIVar17->IO).MousePos = IVar42;
      (pIVar17->IO).WantSetMousePos = true;
    }
    pIVar17->NavMousePosDirty = false;
  }
  pIVar17->NavIdIsAlive = false;
  pIVar17->NavJustTabbedId = 0;
  IVar33 = pIVar17->NavLayer;
  if (ImGuiNavLayer_Menu < IVar33) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0x2038,"void ImGui::NavUpdate()");
  }
  pIVar26 = pIVar17->NavWindow;
  pIVar28 = pIVar26;
  if (pIVar26 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar28->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar28 != pIVar26) {
          pIVar28->NavLastChildNavWindow = pIVar26;
        }
        break;
      }
      ppIVar14 = &pIVar28->ParentWindow;
      pIVar28 = *ppIVar14;
    } while (*ppIVar14 != (ImGuiWindow *)0x0);
    if (((pIVar26 != (ImGuiWindow *)0x0) && (IVar33 == ImGuiNavLayer_Main)) &&
       (pIVar26->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar26->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar19 = GImGui;
  pIVar26 = GetTopMostPopupModal();
  if (pIVar26 == (ImGuiWindow *)0x0) {
    if ((pIVar19->NavWindowingTargetAnim != (ImGuiWindow *)0x0) &&
       (pIVar19->NavWindowingTarget == (ImGuiWindow *)0x0)) {
      fVar40 = (pIVar19->IO).DeltaTime * -10.0 + pIVar19->NavWindowingHighlightAlpha;
      fVar40 = (float)(-(uint)(0.0 <= fVar40) & (uint)fVar40);
      pIVar19->NavWindowingHighlightAlpha = fVar40;
      if ((pIVar19->DimBgRatio <= 0.0) && (fVar40 <= 0.0)) {
        pIVar19->NavWindowingTargetAnim = (ImGuiWindow *)0x0;
      }
    }
    if (pIVar19->NavWindowingTarget == (ImGuiWindow *)0x0) {
      bVar36 = (pIVar19->IO).NavInputsDownDuration[3] == 0.0;
    }
    else {
      bVar36 = false;
    }
    local_58._0_4_ = uVar38;
    if ((((pIVar19->NavWindowingTarget == (ImGuiWindow *)0x0) && ((pIVar19->IO).KeyCtrl == true)) &&
        (iVar24 = (pIVar19->IO).KeyMap[0], -1 < iVar24)) &&
       (bVar22 = IsKeyPressed(iVar24,true), bVar22)) {
      bVar37 = (byte)(pIVar19->IO).ConfigFlags & 1;
    }
    else {
      bVar37 = 0;
    }
    if (bVar36 || bVar37 != 0) {
      pIVar26 = pIVar19->NavWindow;
      if (pIVar26 == (ImGuiWindow *)0x0) {
        pIVar26 = FindWindowNavFocusable((pIVar19->WindowsFocusOrder).Size + -1,-0x7fffffff,-1);
      }
      if (pIVar26 != (ImGuiWindow *)0x0) {
        pIVar19->NavWindowingTargetAnim = pIVar26;
        pIVar19->NavWindowingTarget = pIVar26;
        pIVar19->NavWindowingTimer = 0.0;
        pIVar19->NavWindowingHighlightAlpha = 0.0;
        pIVar19->NavWindowingToggleLayer = (bool)(bVar37 ^ 1);
        pIVar19->NavInputSource = ImGuiInputSource_NavGamepad - bVar37;
      }
    }
    fVar40 = (pIVar19->IO).DeltaTime + pIVar19->NavWindowingTimer;
    pIVar19->NavWindowingTimer = fVar40;
    if ((pIVar19->NavWindowingTarget == (ImGuiWindow *)0x0) ||
       (pIVar19->NavInputSource != ImGuiInputSource_NavGamepad)) {
LAB_0013ceef:
      bVar36 = false;
      pIVar26 = (ImGuiWindow *)0x0;
    }
    else {
      fVar49 = (fVar40 + -0.2) / 0.05;
      fVar40 = 1.0;
      if (fVar49 <= 1.0) {
        fVar40 = fVar49;
      }
      fVar40 = (float)(~-(uint)(fVar49 < 0.0) & (uint)fVar40);
      uVar38 = -(uint)(fVar40 <= pIVar19->NavWindowingHighlightAlpha);
      pIVar19->NavWindowingHighlightAlpha =
           (float)(uVar38 & (uint)pIVar19->NavWindowingHighlightAlpha | ~uVar38 & (uint)fVar40);
      fVar40 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
      fVar49 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
      iVar24 = (uint)(0.0 < fVar40) - (uint)(0.0 < fVar49);
      if (iVar24 != 0) {
        NavUpdateWindowingHighlightWindow(iVar24);
        pIVar19->NavWindowingHighlightAlpha = 1.0;
      }
      if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_0013ceef;
      pbVar5 = &pIVar19->NavWindowingToggleLayer;
      *pbVar5 = (bool)(*pbVar5 &
                      (pIVar19->NavWindowingHighlightAlpha <= 1.0 &&
                      pIVar19->NavWindowingHighlightAlpha != 1.0));
      if (*pbVar5 == false) {
        pIVar26 = pIVar19->NavWindowingTarget;
        bVar36 = false;
      }
      else {
        bVar36 = pIVar19->NavWindow != (ImGuiWindow *)0x0;
        pIVar26 = (ImGuiWindow *)0x0;
      }
      pIVar19->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    if ((pIVar19->NavWindowingTarget != (ImGuiWindow *)0x0) &&
       (pIVar19->NavInputSource == ImGuiInputSource_NavKeyboard)) {
      fVar49 = (pIVar19->NavWindowingTimer + -0.2) / 0.05;
      fVar40 = 1.0;
      if (fVar49 <= 1.0) {
        fVar40 = fVar49;
      }
      fVar40 = (float)(~-(uint)(fVar49 < 0.0) & (uint)fVar40);
      uVar38 = -(uint)(fVar40 <= pIVar19->NavWindowingHighlightAlpha);
      pIVar19->NavWindowingHighlightAlpha =
           (float)(uVar38 & (uint)pIVar19->NavWindowingHighlightAlpha | ~uVar38 & (uint)fVar40);
      iVar24 = (GImGui->IO).KeyMap[0];
      if ((-1 < iVar24) && (bVar22 = IsKeyPressed(iVar24,true), bVar22)) {
        NavUpdateWindowingHighlightWindow((pIVar19->IO).KeyShift - 1 | 1);
      }
      if ((pIVar19->IO).KeyCtrl == false) {
        pIVar26 = pIVar19->NavWindowingTarget;
      }
    }
    pIVar18 = GImGui;
    fVar40 = (GImGui->IO).NavInputsDownDuration[0x10];
    if ((fVar40 == 0.0) && (!NAN(fVar40))) {
      pIVar19->NavWindowingToggleLayer = true;
    }
    bVar22 = bVar36;
    if ((((pIVar19->ActiveId == 0) || (pIVar19->ActiveIdAllowOverlap == true)) && (fVar40 < 0.0)) &&
       ((pIVar19->NavWindowingToggleLayer != false &&
        (0.0 <= (pIVar18->IO).NavInputsDownDurationPrev[0x10])))) {
      bVar20 = IsMousePosValid(&(pIVar19->IO).MousePos);
      bVar21 = IsMousePosValid(&(pIVar19->IO).MousePosPrev);
      bVar22 = true;
      if (bVar21 != bVar20) {
        bVar22 = bVar36;
      }
    }
    pIVar28 = pIVar19->NavWindowingTarget;
    if ((pIVar28 != (ImGuiWindow *)0x0) && ((pIVar28->Flags & 4) == 0)) {
      IVar11 = pIVar19->NavInputSource;
      IVar42.x = 0.0;
      IVar42.y = 0.0;
      if ((IVar11 == ImGuiInputSource_NavKeyboard) && ((pIVar19->IO).KeyShift == false)) {
        IVar42 = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
      }
      if (IVar11 == ImGuiInputSource_NavGamepad) {
        IVar42 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.0,0.0);
      }
      fVar40 = IVar42.y;
      if (((IVar42.x != 0.0) || (fVar40 != 0.0)) || (NAN(fVar40))) {
        fVar49 = (pIVar19->IO).DisplayFramebufferScale.x;
        fVar48 = (pIVar19->IO).DisplayFramebufferScale.y;
        if (fVar48 <= fVar49) {
          fVar49 = fVar48;
        }
        fVar49 = (float)(int)(fVar49 * (pIVar19->IO).DeltaTime * 800.0);
        pIVar28 = pIVar28->RootWindow;
        local_68.Min.x = IVar42.x * fVar49 + (pIVar28->Pos).x;
        local_68.Min.y = fVar40 * fVar49 + (pIVar28->Pos).y;
        SetWindowPos(pIVar28,&local_68.Min,1);
        pIVar19->NavDisableMouseHover = true;
        if (((pIVar19->NavWindowingTarget->Flags & 0x100) == 0) &&
           (GImGui->SettingsDirtyTimer <= 0.0)) {
          GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
        }
      }
    }
    pIVar18 = GImGui;
    if (pIVar26 != (ImGuiWindow *)0x0) {
      if ((pIVar19->NavWindow == (ImGuiWindow *)0x0) || (pIVar26 != pIVar19->NavWindow->RootWindow))
      {
        bVar36 = GImGui->ActiveId != 0;
        GImGui->ActiveIdIsJustActivated = bVar36;
        if (bVar36) {
          pIVar18->ActiveIdTimer = 0.0;
          pIVar18->ActiveIdHasBeenPressedBefore = false;
          pIVar18->ActiveIdHasBeenEditedBefore = false;
        }
        pIVar18->ActiveId = 0;
        pIVar18->ActiveIdAllowNavDirFlags = 0;
        pIVar18->ActiveIdBlockNavInputFlags = 0;
        pIVar18->ActiveIdAllowOverlap = false;
        pIVar18->ActiveIdWindow = (ImGuiWindow *)0x0;
        pIVar18->ActiveIdHasBeenEditedThisFrame = false;
        pIVar19->NavDisableHighlight = false;
        pIVar19->NavDisableMouseHover = true;
        pIVar28 = pIVar26->NavLastChildNavWindow;
        if (pIVar26->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
          pIVar28 = pIVar26;
        }
        ClosePopupsOverWindow(pIVar28,false);
        FocusWindow(pIVar28);
        if (pIVar28->NavLastIds[0] == 0) {
          NavInitWindow(pIVar28,false);
        }
        if ((pIVar28->DC).NavLayerActiveMask == 2) {
          pIVar19->NavLayer = ImGuiNavLayer_Menu;
        }
      }
      pIVar19->NavWindowingTarget = (ImGuiWindow *)0x0;
    }
    uVar38 = local_58._0_4_;
    if ((bVar22) && (pIVar26 = pIVar19->NavWindow, pIVar28 = pIVar26, pIVar26 != (ImGuiWindow *)0x0)
       ) {
      while (window_00 = pIVar28, window_00->ParentWindow != (ImGuiWindow *)0x0) {
        if ((((window_00->DC).NavLayerActiveMask & 2) != 0) ||
           (pIVar28 = window_00->ParentWindow, (window_00->Flags & 0x15000000U) != 0x1000000))
        break;
      }
      if (window_00 != pIVar26) {
        FocusWindow(window_00);
        window_00->NavLastChildNavWindow = pIVar26;
      }
      pIVar19->NavDisableHighlight = false;
      pIVar19->NavDisableMouseHover = true;
      IVar33 = ImGuiNavLayer_Main;
      if (((pIVar19->NavWindow->DC).NavLayerActiveMask & 2) != 0) {
        IVar33 = pIVar19->NavLayer ^ ImGuiNavLayer_Menu;
      }
      NavRestoreLayer(IVar33);
    }
  }
  else {
    pIVar19->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((((uVar38 & 1) == 0 & (bVar35 ^ 1)) == 0) && (pIVar17->NavWindow != (ImGuiWindow *)0x0)) {
    bVar36 = (pIVar17->NavWindow->Flags & 0x40000U) == 0;
    (pIVar17->IO).NavActive = bVar36;
    if (((!bVar36) || (pIVar17->NavId == 0)) ||
       (bVar36 = true, pIVar17->NavDisableHighlight != false)) goto LAB_0013d2df;
  }
  else {
    (pIVar17->IO).NavActive = false;
LAB_0013d2df:
    bVar36 = pIVar17->NavWindowingTarget != (ImGuiWindow *)0x0;
  }
  (pIVar17->IO).NavVisible = bVar36;
  pIVar19 = GImGui;
  fVar40 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar40 == 0.0) && (!NAN(fVar40))) {
    if (pIVar17->ActiveId == 0) {
      pIVar26 = pIVar17->NavWindow;
      if (((pIVar26 == (ImGuiWindow *)0x0) || ((pIVar26->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar26->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar24 = (pIVar17->OpenPopupStack).Size;
        if ((long)iVar24 < 1) {
          if (pIVar17->NavLayer == ImGuiNavLayer_Main) {
            if ((pIVar26 != (ImGuiWindow *)0x0) && ((pIVar26->Flags & 0x5000000U) != 0x1000000)) {
              pIVar26->NavLastIds[0] = 0;
            }
            pIVar17->NavId = 0;
          }
          else {
            NavRestoreLayer(ImGuiNavLayer_Main);
          }
        }
        else if ((((pIVar17->OpenPopupStack).Data[(long)iVar24 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar24 + -1,true);
        }
      }
      else {
        if (pIVar26->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                        ,0x2054,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar26->ParentWindow);
        ppIVar14 = &GImGui->NavWindow;
        if (*ppIVar14 == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                        ,0xae4,"void ImGui::SetNavID(ImGuiID, int)");
        }
        IVar10 = pIVar26->ChildId;
        GImGui->NavId = IVar10;
        (*ppIVar14)->NavLastIds[0] = IVar10;
        pIVar17->NavIdIsAlive = false;
        if (pIVar17->NavDisableMouseHover == true) {
          pIVar17->NavMousePosDirty = true;
        }
      }
    }
    else if ((pIVar17->ActiveIdBlockNavInputFlags & 2) == 0) {
      bVar36 = GImGui->ActiveId != 0;
      GImGui->ActiveIdIsJustActivated = bVar36;
      if (bVar36) {
        pIVar19->ActiveIdTimer = 0.0;
        pIVar19->ActiveIdHasBeenPressedBefore = false;
        pIVar19->ActiveIdHasBeenEditedBefore = false;
      }
      pIVar19->ActiveId = 0;
      pIVar19->ActiveIdAllowNavDirFlags = 0;
      pIVar19->ActiveIdBlockNavInputFlags = 0;
      pIVar19->ActiveIdAllowOverlap = false;
      pIVar19->ActiveIdWindow = (ImGuiWindow *)0x0;
      pIVar19->ActiveIdHasBeenEditedThisFrame = false;
    }
  }
  pIVar17->NavActivateId = 0;
  pIVar17->NavActivateDownId = 0;
  pIVar17->NavActivatePressedId = 0;
  pIVar19 = GImGui;
  pIVar17->NavInputId = 0;
  IVar10 = pIVar17->NavId;
  if ((((IVar10 != 0) && (pIVar17->NavDisableHighlight == false)) &&
      (pIVar17->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
     ((pIVar17->NavWindow != (ImGuiWindow *)0x0 && ((pIVar17->NavWindow->Flags & 0x40000) == 0)))) {
    fVar40 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar40) {
      bVar36 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
    }
    else {
      bVar36 = false;
    }
    IVar12 = pIVar17->ActiveId;
    if (bVar36 && IVar12 == 0) {
      pIVar17->NavActivateId = IVar10;
    }
    if (IVar12 == 0) {
      if (0.0 < fVar40) goto LAB_0013eadf;
    }
    else if (IVar12 == IVar10 && 0.0 < fVar40) {
LAB_0013eadf:
      pIVar17->NavActivateDownId = IVar10;
    }
    if (IVar12 == 0) {
      if (bVar36) goto LAB_0013eaf6;
    }
    else if ((bool)(bVar36 & IVar12 == IVar10)) {
LAB_0013eaf6:
      pIVar17->NavActivatePressedId = IVar10;
    }
    if (((IVar12 == 0 || IVar12 == IVar10) &&
        (fVar40 = (pIVar19->IO).NavInputsDownDuration[2], fVar40 == 0.0)) && (!NAN(fVar40))) {
      pIVar17->NavInputId = IVar10;
    }
  }
  pIVar26 = pIVar17->NavWindow;
  if ((pIVar26 != (ImGuiWindow *)0x0) && ((pIVar26->Flags & 0x40000) != 0)) {
    pIVar17->NavDisableHighlight = true;
  }
  IVar10 = pIVar17->NavActivateId;
  if ((IVar10 != 0) && (pIVar17->NavActivateDownId != IVar10)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0x2081,"void ImGui::NavUpdate()");
  }
  pIVar17->NavMoveRequest = false;
  IVar10 = pIVar17->NavNextActivateId;
  if (IVar10 != 0) {
    pIVar17->NavInputId = IVar10;
    pIVar17->NavActivatePressedId = IVar10;
    pIVar17->NavActivateDownId = IVar10;
    pIVar17->NavActivateId = IVar10;
  }
  pIVar17->NavNextActivateId = 0;
  if (pIVar17->ActiveId == 0) {
    uVar39 = 0xffffffff;
  }
  else {
    uVar39 = pIVar17->ActiveIdAllowNavDirFlags;
  }
  if (pIVar17->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar17->NavMoveDir = -1;
    pIVar17->NavMoveRequestFlags = 0;
    if (((pIVar26 != (ImGuiWindow *)0x0) &&
        (uVar39 != 0 && pIVar17->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar26->Flags & 0x40000) == 0)) {
      if ((uVar39 & 1) != 0) {
        fVar40 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat);
        fVar49 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar49 + fVar40) {
          pIVar17->NavMoveDir = 0;
        }
      }
      if ((uVar39 & 2) != 0) {
        fVar40 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat);
        fVar49 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar49 + fVar40) {
          pIVar17->NavMoveDir = 1;
        }
      }
      if ((uVar39 & 4) != 0) {
        fVar40 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat);
        fVar49 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar49 + fVar40) {
          pIVar17->NavMoveDir = 2;
        }
      }
      if ((uVar39 & 8) != 0) {
        fVar40 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat);
        fVar49 = GetNavInputAmount(0x15,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar49 + fVar40) {
          pIVar17->NavMoveDir = 3;
        }
      }
    }
    pIVar17->NavMoveClipDir = pIVar17->NavMoveDir;
  }
  else {
    if ((pIVar17->NavMoveDir == -1) || (pIVar17->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0x209c,"void ImGui::NavUpdate()");
    }
    if (pIVar17->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0x209d,"void ImGui::NavUpdate()");
    }
    pIVar17->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  pIVar19 = GImGui;
  fVar40 = 0.0;
  if ((((uVar38 & 1) != 0) && (GImGui->NavMoveDir == -1)) &&
     ((pIVar26 = GImGui->NavWindow, pIVar26 != (ImGuiWindow *)0x0 &&
      ((((pIVar26->Flags & 0x40000) == 0 && (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       (GImGui->NavLayer == ImGuiNavLayer_Main)))))) {
    bVar36 = IsKeyDown((GImGui->IO).KeyMap[5]);
    bVar22 = IsKeyDown((pIVar19->IO).KeyMap[6]);
    if (((byte)uVar39 >> 2 & bVar36) != ((byte)uVar39 >> 3 & bVar22)) {
      if (((pIVar26->DC).NavLayerActiveMask != 0) || ((pIVar26->DC).NavHasScroll != true)) {
        fVar40 = GImGui->FontBaseSize * pIVar26->FontWindowScale;
        if (pIVar26->ParentWindow != (ImGuiWindow *)0x0) {
          fVar40 = fVar40 * pIVar26->ParentWindow->FontWindowScale;
        }
        fVar49 = (pIVar26->NavRectRel[pIVar19->NavLayer].Max.y -
                 pIVar26->NavRectRel[pIVar19->NavLayer].Min.y) +
                 (((pIVar26->InnerRect).Max.y - (pIVar26->InnerRect).Min.y) - fVar40);
        fVar49 = (float)(~-(uint)(fVar49 <= 0.0) & (uint)fVar49);
        bVar36 = IsKeyPressed((pIVar19->IO).KeyMap[5],true);
        if (bVar36) {
          pIVar19->NavMoveDir = 3;
          pIVar19->NavMoveClipDir = 2;
          pIVar19->NavMoveRequestFlags = 0x30;
          fVar40 = -fVar49;
        }
        else {
          bVar36 = IsKeyPressed((pIVar19->IO).KeyMap[6],true);
          fVar40 = 0.0;
          if (bVar36) {
            pIVar19->NavMoveDir = 2;
            pIVar19->NavMoveClipDir = 3;
            pIVar19->NavMoveRequestFlags = 0x30;
            fVar40 = fVar49;
          }
        }
        goto LAB_0013d792;
      }
      bVar36 = IsKeyPressed((pIVar19->IO).KeyMap[5],true);
      if (bVar36) {
        (pIVar26->ScrollTarget).y =
             (pIVar26->Scroll).y - ((pIVar26->InnerRect).Max.y - (pIVar26->InnerRect).Min.y);
      }
      else {
        bVar36 = IsKeyPressed((pIVar19->IO).KeyMap[6],true);
        if (!bVar36) goto LAB_0013ed01;
        (pIVar26->ScrollTarget).y =
             ((pIVar26->InnerRect).Max.y - (pIVar26->InnerRect).Min.y) + (pIVar26->Scroll).y;
      }
      (pIVar26->ScrollTargetCenterRatio).y = 0.0;
    }
LAB_0013ed01:
    fVar40 = 0.0;
  }
LAB_0013d792:
  uVar38 = pIVar17->NavMoveDir;
  if (uVar38 != 0xffffffff) {
    pIVar17->NavMoveRequest = true;
    pIVar17->NavMoveDirLast = uVar38;
  }
  bVar36 = pIVar17->NavMoveRequest;
  if ((bVar36 == true) && (pIVar17->NavId == 0)) {
    pIVar17->NavInitRequest = true;
    pIVar17->NavInitRequestFromMove = true;
    pIVar17->NavInitResultId = 0;
    pIVar17->NavDisableHighlight = false;
  }
  pIVar19 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar5 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar5;
    if (*pbVar5 != false) goto LAB_0013d80f;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_0013d80f:
    if (pIVar19->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                    ,0x1f6f,"void ImGui::NavUpdateAnyRequestFlag()");
    }
  }
  pIVar26 = pIVar17->NavWindow;
  if (((pIVar26 != (ImGuiWindow *)0x0) && ((pIVar26->Flags & 0x40000) == 0)) &&
     (pIVar17->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar49 = pIVar19->FontBaseSize * pIVar26->FontWindowScale;
    if (pIVar26->ParentWindow != (ImGuiWindow *)0x0) {
      fVar49 = fVar49 * pIVar26->ParentWindow->FontWindowScale;
    }
    fVar49 = (float)(int)(fVar49 * 100.0 * (pIVar17->IO).DeltaTime + 0.5);
    local_58 = ZEXT416((uint)fVar49);
    if (((pIVar26->DC).NavLayerActiveMask == 0) && (((pIVar26->DC).NavHasScroll & bVar36) == 1)) {
      if (uVar38 < 2) {
        (pIVar26->ScrollTarget).x =
             (float)(int)(*(float *)(&DAT_001900d8 + (ulong)(uVar38 == 0) * 4) * fVar49 +
                         (pIVar26->Scroll).x);
        (pIVar26->ScrollTargetCenterRatio).x = 0.0;
      }
      if ((uVar38 & 0xfffffffe) == 2) {
        (pIVar26->ScrollTarget).y =
             (float)(int)(*(float *)(&DAT_001900d8 + (ulong)(uVar38 == 2) * 4) * fVar49 +
                         (pIVar26->Scroll).y);
        (pIVar26->ScrollTargetCenterRatio).y = 0.0;
      }
    }
    IVar42 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar49 = IVar42.x;
    fVar48 = IVar42.y;
    if (((fVar49 != 0.0) || (NAN(fVar49))) && (pIVar26->ScrollbarX == true)) {
      (pIVar26->ScrollTarget).x = (float)(int)(fVar49 * (float)local_58._0_4_ + (pIVar26->Scroll).x)
      ;
      (pIVar26->ScrollTargetCenterRatio).x = 0.0;
      pIVar17->NavMoveFromClampedRefRect = true;
    }
    if ((fVar48 != 0.0) || (NAN(fVar48))) {
      (pIVar26->ScrollTarget).y = (float)(int)(fVar48 * (float)local_58._0_4_ + (pIVar26->Scroll).y)
      ;
      (pIVar26->ScrollTargetCenterRatio).y = 0.0;
      pIVar17->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar17->NavMoveResultLocal).ID = 0;
  (pIVar17->NavMoveResultLocal).SelectScopeId = 0;
  (pIVar17->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar17->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar17->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar17->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar17->NavMoveResultLocal).RectRel.Min.x = 3.4028235e+38;
  (pIVar17->NavMoveResultLocal).RectRel.Min.y = 3.4028235e+38;
  (pIVar17->NavMoveResultLocal).RectRel.Max.x = -3.4028235e+38;
  (pIVar17->NavMoveResultLocal).RectRel.Max.y = -3.4028235e+38;
  (pIVar17->NavMoveResultLocalVisibleSet).ID = 0;
  (pIVar17->NavMoveResultLocalVisibleSet).SelectScopeId = 0;
  (pIVar17->NavMoveResultLocalVisibleSet).Window = (ImGuiWindow *)0x0;
  (pIVar17->NavMoveResultLocalVisibleSet).DistAxial = 3.4028235e+38;
  (pIVar17->NavMoveResultLocalVisibleSet).DistBox = 3.4028235e+38;
  (pIVar17->NavMoveResultLocalVisibleSet).DistCenter = 3.4028235e+38;
  (pIVar17->NavMoveResultLocalVisibleSet).RectRel.Min.x = 3.4028235e+38;
  (pIVar17->NavMoveResultLocalVisibleSet).RectRel.Min.y = 3.4028235e+38;
  (pIVar17->NavMoveResultLocalVisibleSet).RectRel.Max.x = -3.4028235e+38;
  (pIVar17->NavMoveResultLocalVisibleSet).RectRel.Max.y = -3.4028235e+38;
  (pIVar17->NavMoveResultOther).ID = 0;
  (pIVar17->NavMoveResultOther).SelectScopeId = 0;
  (pIVar17->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar17->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar17->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar17->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar17->NavMoveResultOther).RectRel.Min.x = 3.4028235e+38;
  (pIVar17->NavMoveResultOther).RectRel.Min.y = 3.4028235e+38;
  (pIVar17->NavMoveResultOther).RectRel.Max.x = -3.4028235e+38;
  (pIVar17->NavMoveResultOther).RectRel.Max.y = -3.4028235e+38;
  if (((bVar36 != false) && (pIVar17->NavMoveFromClampedRefRect == true)) &&
     (pIVar17->NavLayer == ImGuiNavLayer_Main)) {
    fVar49 = (pIVar26->Pos).x;
    fVar48 = (pIVar26->Pos).y;
    fVar51 = ((pIVar26->InnerRect).Min.x - fVar49) + -1.0;
    fVar50 = ((pIVar26->InnerRect).Min.y - fVar48) + -1.0;
    fVar41 = ((pIVar26->InnerRect).Max.x - fVar49) + 1.0;
    fVar48 = ((pIVar26->InnerRect).Max.y - fVar48) + 1.0;
    fVar49 = pIVar26->NavRectRel[0].Min.x;
    if (((fVar49 < fVar51) || (pIVar26->NavRectRel[0].Min.y < fVar50)) ||
       ((fVar41 < pIVar26->NavRectRel[0].Max.x || (fVar48 < pIVar26->NavRectRel[0].Max.y)))) {
      fVar53 = pIVar19->FontBaseSize * pIVar26->FontWindowScale;
      if (pIVar26->ParentWindow != (ImGuiWindow *)0x0) {
        fVar53 = fVar53 * pIVar26->ParentWindow->FontWindowScale;
      }
      fVar53 = fVar53 * 0.5;
      fVar54 = fVar41 - fVar51;
      if (fVar53 <= fVar41 - fVar51) {
        fVar54 = fVar53;
      }
      fVar55 = fVar48 - fVar50;
      if (fVar53 <= fVar48 - fVar50) {
        fVar55 = fVar53;
      }
      uVar38 = -(uint)(fVar51 + fVar54 <= fVar49);
      fVar53 = pIVar26->NavRectRel[0].Min.y;
      fVar9 = pIVar26->NavRectRel[0].Max.x;
      uVar39 = -(uint)(fVar50 + fVar55 <= fVar53);
      pIVar26->NavRectRel[0].Min.x =
           (float)(uVar38 & (uint)fVar49 | ~uVar38 & (uint)(fVar51 + fVar54));
      pIVar26->NavRectRel[0].Min.y =
           (float)(uVar39 & (uint)fVar53 | ~uVar39 & (uint)(fVar50 + fVar55));
      if (fVar41 - fVar54 <= fVar9) {
        fVar9 = fVar41 - fVar54;
      }
      fVar49 = pIVar26->NavRectRel[0].Max.y;
      if (fVar48 - fVar55 <= fVar49) {
        fVar49 = fVar48 - fVar55;
      }
      IVar52.y = fVar49;
      IVar52.x = fVar9;
      pIVar26->NavRectRel[0].Max = IVar52;
      pIVar17->NavId = 0;
    }
    pIVar17->NavMoveFromClampedRefRect = false;
  }
  pIVar26 = pIVar17->NavWindow;
  if (pIVar26 == (ImGuiWindow *)0x0) {
LAB_0013dbf0:
    fVar50 = 0.0;
    fVar48 = 0.0;
    fVar41 = 0.0;
    fVar49 = 0.0;
  }
  else {
    IVar33 = pIVar17->NavLayer;
    fVar49 = pIVar26->NavRectRel[IVar33].Min.x;
    fVar48 = pIVar26->NavRectRel[IVar33].Max.x;
    if (fVar48 < fVar49) goto LAB_0013dbf0;
    fVar41 = pIVar26->NavRectRel[IVar33].Min.y;
    fVar50 = pIVar26->NavRectRel[IVar33].Max.y;
    if (fVar50 < fVar41) goto LAB_0013dbf0;
  }
  if (pIVar26 == (ImGuiWindow *)0x0) {
    fVar48 = (GImGui->IO).DisplaySize.x;
    fVar50 = (GImGui->IO).DisplaySize.y;
    fVar49 = 0.0;
    fVar41 = 0.0;
  }
  else {
    fVar51 = (pIVar26->Pos).x;
    fVar53 = (pIVar26->Pos).y;
    fVar49 = fVar49 + fVar51;
    fVar41 = fVar41 + fVar53;
    fVar48 = fVar48 + fVar51;
    fVar50 = fVar50 + fVar53;
  }
  (pIVar17->NavScoringRectScreen).Min.x = fVar49;
  (pIVar17->NavScoringRectScreen).Min.y = fVar41;
  (pIVar17->NavScoringRectScreen).Max.x = fVar48;
  (pIVar17->NavScoringRectScreen).Max.y = fVar50;
  fVar41 = (pIVar17->NavScoringRectScreen).Min.y + fVar40;
  (pIVar17->NavScoringRectScreen).Min.y = fVar41;
  fVar40 = fVar40 + (pIVar17->NavScoringRectScreen).Max.y;
  (pIVar17->NavScoringRectScreen).Max.y = fVar40;
  fVar48 = (pIVar17->NavScoringRectScreen).Min.x + 1.0;
  fVar49 = (pIVar17->NavScoringRectScreen).Max.x;
  if (fVar49 <= fVar48) {
    fVar48 = fVar49;
  }
  (pIVar17->NavScoringRectScreen).Min.x = fVar48;
  (pIVar17->NavScoringRectScreen).Max.x = fVar48;
  if (fVar40 < fVar41) {
    __assert_fail("!g.NavScoringRectScreen.IsInverted()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0x20eb,"void ImGui::NavUpdate()");
  }
  pIVar17->NavScoringCount = 0;
  pIVar17 = GImGui;
  pIVar8 = &(GImGui->IO).MousePos;
  bVar36 = IsMousePosValid(pIVar8);
  if (bVar36) {
    IVar43.x = (float)(int)(pIVar17->IO).MousePos.x;
    IVar43.y = (float)(int)(pIVar17->IO).MousePos.y;
    pIVar17->LastValidMousePos = IVar43;
    (pIVar17->IO).MousePos = IVar43;
  }
  bVar36 = IsMousePosValid(pIVar8);
  if ((bVar36) && (bVar36 = IsMousePosValid(&(pIVar17->IO).MousePosPrev), bVar36)) {
    IVar44.x = (pIVar17->IO).MousePos.x - (pIVar17->IO).MousePosPrev.x;
    IVar44.y = (pIVar17->IO).MousePos.y - (pIVar17->IO).MousePosPrev.y;
    (pIVar17->IO).MouseDelta = IVar44;
  }
  else {
    (pIVar17->IO).MouseDelta.x = 0.0;
    (pIVar17->IO).MouseDelta.y = 0.0;
  }
  if ((((pIVar17->IO).MouseDelta.x != 0.0) || (fVar40 = (pIVar17->IO).MouseDelta.y, fVar40 != 0.0))
     || (NAN(fVar40))) {
    pIVar17->NavDisableMouseHover = false;
  }
  (pIVar17->IO).MousePosPrev = (pIVar17->IO).MousePos;
  lVar25 = -5;
  do {
    fVar40 = -1.0;
    bVar36 = (pIVar17->IO).MouseDown[lVar25 + 5];
    if (bVar36 == true) {
      pfVar3 = (pIVar17->IO).MouseDownDurationPrev + lVar25;
      bVar22 = *pfVar3 <= 0.0 && *pfVar3 != 0.0;
    }
    else {
      bVar22 = false;
    }
    (pIVar17->IO).MouseDoubleClicked[lVar25] = bVar22;
    if (bVar36 == false) {
      bVar20 = 0.0 <= (pIVar17->IO).MouseDownDurationPrev[lVar25];
    }
    else {
      bVar20 = false;
    }
    (pIVar17->IO).MouseDownOwned[lVar25] = bVar20;
    fVar49 = (pIVar17->IO).MouseDownDurationPrev[lVar25];
    (&(pIVar17->IO).MouseDragMaxDistanceAbs[0].x)[lVar25] = fVar49;
    if ((bVar36 != false) && (fVar40 = 0.0, 0.0 <= fVar49)) {
      fVar40 = fVar49 + (pIVar17->IO).DeltaTime;
    }
    (pIVar17->IO).MouseDownDurationPrev[lVar25] = fVar40;
    (pIVar17->IO).MouseReleased[lVar25] = false;
    if (bVar22 == false) {
      if (bVar36 != false) {
        bVar36 = IsMousePosValid(pIVar8);
        fVar40 = 0.0;
        fVar49 = 0.0;
        if (bVar36) {
          fVar40 = (pIVar17->IO).MousePos.x -
                   *(float *)((long)(pIVar17->IO).MouseClickedTime + lVar25 * 8 + -4);
          fVar49 = (pIVar17->IO).MousePos.y - *(float *)((pIVar17->IO).MouseClickedTime + lVar25);
        }
        fVar48 = (pIVar17->IO).KeysDownDuration[lVar25];
        fVar41 = -fVar49;
        if (-fVar49 <= fVar49) {
          fVar41 = fVar49;
        }
        fVar49 = fVar40 * fVar40 + fVar49 * fVar49;
        uVar38 = -(uint)(fVar49 <= fVar48);
        (pIVar17->IO).KeysDownDuration[lVar25] =
             (float)(~uVar38 & (uint)fVar49 | (uint)fVar48 & uVar38);
        fVar49 = -fVar40;
        if (-fVar40 <= fVar40) {
          fVar49 = fVar40;
        }
        fVar40 = (pIVar17->IO).MouseDragMaxDistanceSqr[lVar25 * 2];
        fVar48 = (pIVar17->IO).MouseDragMaxDistanceSqr[lVar25 * 2 + 1];
        uVar38 = -(uint)(fVar49 <= fVar40);
        (pIVar17->IO).MouseDragMaxDistanceSqr[lVar25 * 2] =
             (float)(~uVar38 & (uint)fVar49 | (uint)fVar40 & uVar38);
        uVar38 = -(uint)(fVar41 <= fVar48);
        (pIVar17->IO).MouseDragMaxDistanceSqr[lVar25 * 2 + 1] =
             (float)(~uVar38 & (uint)fVar41 | (uint)fVar48 & uVar38);
      }
    }
    else {
      dVar45 = pIVar17->Time;
      if ((float)(dVar45 - *(double *)((pIVar17->IO).MouseClicked + lVar25 * 8)) <
          (pIVar17->IO).MouseDoubleClickTime) {
        bVar36 = IsMousePosValid(pIVar8);
        fVar40 = 0.0;
        fVar49 = 0.0;
        if (bVar36) {
          fVar40 = (pIVar17->IO).MousePos.x -
                   *(float *)((long)(pIVar17->IO).MouseClickedTime + lVar25 * 8 + -4);
          fVar49 = (pIVar17->IO).MousePos.y - *(float *)((pIVar17->IO).MouseClickedTime + lVar25);
        }
        fVar48 = (pIVar17->IO).MouseDoubleClickMaxDist;
        dVar45 = -3.4028234663852886e+38;
        if (fVar40 * fVar40 + fVar49 * fVar49 < fVar48 * fVar48) {
          (pIVar17->IO).MouseReleased[lVar25] = true;
          dVar45 = -3.4028234663852886e+38;
        }
      }
      *(double *)((pIVar17->IO).MouseClicked + lVar25 * 8) = dVar45;
      *(ImVec2 *)((long)(pIVar17->IO).MouseClickedTime + lVar25 * 8 + -4) = (pIVar17->IO).MousePos;
      *(bool *)((long)(pIVar17->IO).MouseDownDuration + lVar25 + -3) =
           (pIVar17->IO).MouseReleased[lVar25];
      pfVar3 = (pIVar17->IO).MouseDragMaxDistanceSqr + lVar25 * 2;
      pfVar3[0] = 0.0;
      pfVar3[1] = 0.0;
      (pIVar17->IO).KeysDownDuration[lVar25] = 0.0;
    }
    if (((pIVar17->IO).MouseDown[lVar25 + 5] == false) &&
       ((pIVar17->IO).MouseDownOwned[lVar25] == false)) {
      *(undefined1 *)((long)(pIVar17->IO).MouseDownDuration + lVar25 + -3) = 0;
    }
    if ((pIVar17->IO).MouseDoubleClicked[lVar25] == true) {
      pIVar17->NavDisableMouseHover = false;
    }
    lVar25 = lVar25 + 1;
  } while (lVar25 != 0);
  fVar40 = (pIVar16->IO).DeltaTime;
  iVar24 = pIVar16->FramerateSecPerFrameIdx;
  pIVar16->FramerateSecPerFrameAccum =
       (fVar40 - pIVar16->FramerateSecPerFrame[iVar24]) + pIVar16->FramerateSecPerFrameAccum;
  pIVar16->FramerateSecPerFrame[iVar24] = fVar40;
  iVar23 = iVar24 + (int)((ulong)((long)(iVar24 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar16->FramerateSecPerFrameIdx = iVar24 + 1 + ((iVar23 >> 6) - (iVar23 >> 0x1f)) * -0x78;
  uVar38 = -(uint)(0.0 < pIVar16->FramerateSecPerFrameAccum);
  (pIVar16->IO).Framerate =
       (float)(~uVar38 & 0x7f7fffff |
              (uint)(1.0 / (pIVar16->FramerateSecPerFrameAccum / 120.0)) & uVar38);
  UpdateHoveredWindowAndCaptureFlags();
  UpdateMouseMovingWindowNewFrame();
  pIVar26 = GetTopMostPopupModal();
  if ((pIVar26 != (ImGuiWindow *)0x0) ||
     ((pIVar16->NavWindowingTarget != (ImGuiWindow *)0x0 &&
      (0.0 < pIVar16->NavWindowingHighlightAlpha)))) {
    fVar40 = (pIVar16->IO).DeltaTime * 6.0 + pIVar16->DimBgRatio;
    if (1.0 <= fVar40) {
      fVar40 = 1.0;
    }
    pIVar16->DimBgRatio = fVar40;
  }
  else {
    fVar40 = (pIVar16->IO).DeltaTime * -10.0 + pIVar16->DimBgRatio;
    pIVar16->DimBgRatio = (float)(-(uint)(0.0 <= fVar40) & (uint)fVar40);
  }
  pIVar16->MouseCursor = 0;
  pIVar16->WantTextInputNextFrame = -1;
  pIVar16->WantCaptureMouseNextFrame = -1;
  pIVar16->WantCaptureKeyboardNextFrame = -1;
  (pIVar16->PlatformImePos).x = 1.0;
  pIVar17 = GImGui;
  (pIVar16->PlatformImePos).y = 1.0;
  if (GImGui->WheelingWindow != (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowTimer = GImGui->WheelingWindowTimer - (GImGui->IO).DeltaTime;
    bVar36 = IsMousePosValid((ImVec2 *)0x0);
    if ((bVar36) &&
       (fVar40 = (pIVar17->IO).MouseDragThreshold,
       fVar49 = (pIVar17->IO).MousePos.x - (pIVar17->WheelingWindowRefMousePos).x,
       fVar48 = (pIVar17->IO).MousePos.y - (pIVar17->WheelingWindowRefMousePos).y,
       fVar40 * fVar40 < fVar49 * fVar49 + fVar48 * fVar48)) {
      pIVar17->WheelingWindowTimer = 0.0;
    }
    if (pIVar17->WheelingWindowTimer <= 0.0) {
      pIVar17->WheelingWindow = (ImGuiWindow *)0x0;
      pIVar17->WheelingWindowTimer = 0.0;
    }
  }
  pIVar19 = GImGui;
  fVar40 = (pIVar17->IO).MouseWheel;
  if (((fVar40 != 0.0) || (fVar49 = (pIVar17->IO).MouseWheelH, fVar49 != 0.0)) || (NAN(fVar49))) {
    pIVar26 = pIVar17->WheelingWindow;
    if (pIVar26 == (ImGuiWindow *)0x0) {
      pIVar26 = pIVar17->HoveredWindow;
    }
    if ((pIVar26 != (ImGuiWindow *)0x0) && (pIVar26->Collapsed == false)) {
      fVar49 = 0.0;
      if ((fVar40 != 0.0) || (NAN(fVar40))) {
        if (((pIVar17->IO).KeyCtrl == true) && ((pIVar17->IO).FontAllowUserScaling == true)) {
          if (GImGui->WheelingWindow != pIVar26) {
            GImGui->WheelingWindow = pIVar26;
            pIVar19->WheelingWindowRefMousePos = (pIVar19->IO).MousePos;
            pIVar19->WheelingWindowTimer = 2.0;
          }
          fVar40 = pIVar26->FontWindowScale;
          fVar48 = (pIVar17->IO).MouseWheel * 0.1 + fVar40;
          fVar49 = 2.5;
          if (fVar48 <= 2.5) {
            fVar49 = fVar48;
          }
          fVar49 = (float)(-(uint)(fVar48 < 0.5) & 0x3f000000 |
                          ~-(uint)(fVar48 < 0.5) & (uint)fVar49);
          pIVar26->FontWindowScale = fVar49;
          if ((pIVar26->Flags & 0x1000000) == 0) {
            fVar49 = fVar49 / fVar40;
            fVar40 = (pIVar26->Size).x;
            fVar48 = (pIVar26->Size).y;
            fVar41 = (pIVar26->Pos).x;
            fVar50 = (pIVar26->Pos).y;
            local_68.Min.y =
                 (((pIVar17->IO).MousePos.y - fVar50) * (1.0 - fVar49) * fVar48) / fVar48 + fVar50;
            local_68.Min.x =
                 (((pIVar17->IO).MousePos.x - fVar41) * (1.0 - fVar49) * fVar40) / fVar40 + fVar41;
            SetWindowPos(pIVar26,&local_68.Min,0);
            IVar46.x = (float)(int)((pIVar26->Size).x * fVar49);
            IVar46.y = (float)(int)((pIVar26->Size).y * fVar49);
            pIVar26->Size = IVar46;
            IVar47.x = (float)(int)((pIVar26->SizeFull).x * fVar49);
            IVar47.y = (float)(int)(fVar49 * (pIVar26->SizeFull).y);
            pIVar26->SizeFull = IVar47;
          }
          goto LAB_0013e64d;
        }
        if ((pIVar17->IO).KeyShift == false) {
          fVar49 = fVar40;
        }
      }
      if (((fVar49 != 0.0) || (NAN(fVar49))) && ((pIVar17->IO).KeyCtrl == false)) {
        if (GImGui->WheelingWindow != pIVar26) {
          GImGui->WheelingWindow = pIVar26;
          pIVar19->WheelingWindowRefMousePos = (pIVar19->IO).MousePos;
          pIVar19->WheelingWindowTimer = 2.0;
        }
        uVar38 = pIVar26->Flags;
        while (((uVar38 >> 0x18 & 1) != 0 &&
               (((uVar38 & 0x210) == 0x10 ||
                ((fVar40 = (pIVar26->ScrollMax).y, fVar40 == 0.0 && (!NAN(fVar40)))))))) {
          pIVar26 = pIVar26->ParentWindow;
          uVar38 = pIVar26->Flags;
        }
        if ((uVar38 & 0x210) == 0) {
          fVar40 = ((pIVar26->InnerRect).Max.y - (pIVar26->InnerRect).Min.y) * 0.67;
          fVar48 = pIVar19->FontBaseSize * pIVar26->FontWindowScale;
          if (pIVar26->ParentWindow != (ImGuiWindow *)0x0) {
            fVar48 = fVar48 * pIVar26->ParentWindow->FontWindowScale;
          }
          fVar41 = fVar48 * 5.0;
          if (fVar40 <= fVar48 * 5.0) {
            fVar41 = fVar40;
          }
          (pIVar26->ScrollTarget).y = (pIVar26->Scroll).y - fVar49 * (float)(int)fVar41;
          (pIVar26->ScrollTargetCenterRatio).y = 0.0;
        }
      }
      pIVar19 = GImGui;
      fVar40 = (pIVar17->IO).MouseWheelH;
      if (((fVar40 == 0.0) && (!NAN(fVar40))) || ((pIVar17->IO).KeyShift == true)) {
        fVar49 = (pIVar17->IO).MouseWheel;
        if ((fVar49 != 0.0) || (NAN(fVar49))) {
          fVar40 = 0.0;
          if ((pIVar17->IO).KeyShift == true) {
            fVar40 = fVar49;
          }
        }
        else {
          fVar40 = 0.0;
        }
      }
      if (((fVar40 != 0.0) || (NAN(fVar40))) && ((pIVar17->IO).KeyCtrl == false)) {
        if (GImGui->WheelingWindow != pIVar26) {
          GImGui->WheelingWindow = pIVar26;
          pIVar19->WheelingWindowRefMousePos = (pIVar19->IO).MousePos;
          pIVar19->WheelingWindowTimer = 2.0;
        }
        while ((uVar38 = pIVar26->Flags, (uVar38 >> 0x18 & 1) != 0 &&
               (((uVar38 & 0x210) == 0x10 ||
                ((fVar49 = (pIVar26->ScrollMax).x, fVar49 == 0.0 && (!NAN(fVar49)))))))) {
          pIVar26 = pIVar26->ParentWindow;
        }
        if ((uVar38 & 0x210) == 0) {
          fVar49 = ((pIVar26->InnerRect).Max.x - (pIVar26->InnerRect).Min.x) * 0.67;
          fVar48 = pIVar19->FontBaseSize * pIVar26->FontWindowScale;
          if (pIVar26->ParentWindow != (ImGuiWindow *)0x0) {
            fVar48 = fVar48 * pIVar26->ParentWindow->FontWindowScale;
          }
          fVar41 = fVar48 + fVar48;
          if (fVar49 <= fVar48 + fVar48) {
            fVar41 = fVar49;
          }
          (pIVar26->ScrollTarget).x = (pIVar26->Scroll).x - fVar40 * (float)(int)fVar41;
          (pIVar26->ScrollTargetCenterRatio).x = 0.0;
        }
      }
    }
  }
LAB_0013e64d:
  pIVar26 = pIVar16->NavWindow;
  if (((pIVar26 == (ImGuiWindow *)0x0) || (pIVar26->Active != true)) ||
     (((pIVar26->Flags & 0x40000) != 0 ||
      (((pIVar16->IO).KeyCtrl != false || (iVar24 = (GImGui->IO).KeyMap[0], iVar24 < 0)))))) {
    bVar36 = false;
  }
  else {
    bVar36 = IsKeyPressed(iVar24,true);
  }
  pIVar16->FocusTabPressed = bVar36;
  if ((bVar36 != false) && (pIVar16->ActiveId == 0)) {
    pIVar16->FocusRequestNextWindow = pIVar16->NavWindow;
    pIVar16->FocusRequestNextCounterAll = 0x7fffffff;
    if ((pIVar16->NavId == 0) || (pIVar16->NavIdTabCounter == 0x7fffffff)) {
      iVar24 = -(uint)(pIVar16->IO).KeyShift;
    }
    else {
      iVar24 = pIVar16->NavIdTabCounter + (-(uint)(pIVar16->IO).KeyShift | 1) + 1;
    }
    pIVar16->FocusRequestNextCounterTab = iVar24;
  }
  pIVar16->FocusRequestCurrWindow = (ImGuiWindow *)0x0;
  pIVar16->FocusRequestCurrCounterAll = 0x7fffffff;
  pIVar16->FocusRequestCurrCounterTab = 0x7fffffff;
  pIVar26 = pIVar16->FocusRequestNextWindow;
  if (pIVar26 != (ImGuiWindow *)0x0) {
    pIVar16->FocusRequestCurrWindow = pIVar26;
    if ((pIVar16->FocusRequestNextCounterAll != 0x7fffffff) &&
       (iVar24 = (pIVar26->DC).FocusCounterAll, iVar24 != -1)) {
      pIVar16->FocusRequestCurrCounterAll =
           (pIVar16->FocusRequestNextCounterAll + iVar24 + 1) % (iVar24 + 1);
    }
    if ((pIVar16->FocusRequestNextCounterTab != 0x7fffffff) &&
       (iVar24 = (pIVar26->DC).FocusCounterTab, iVar24 != -1)) {
      pIVar16->FocusRequestCurrCounterTab =
           (pIVar16->FocusRequestNextCounterTab + iVar24 + 1) % (iVar24 + 1);
    }
    pIVar16->FocusRequestNextWindow = (ImGuiWindow *)0x0;
    pIVar16->FocusRequestNextCounterAll = 0x7fffffff;
    pIVar16->FocusRequestNextCounterTab = 0x7fffffff;
  }
  pIVar16->NavIdTabCounter = 0x7fffffff;
  uVar38 = (pIVar16->Windows).Size;
  if ((pIVar16->WindowsFocusOrder).Size != uVar38) {
    __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/awolven[P]cimgui/imgui/imgui.cpp"
                  ,0xee7,"void ImGui::NewFrame()");
  }
  if ((ulong)uVar38 != 0) {
    uVar29 = 0;
    if (0 < (int)uVar38) {
      uVar29 = (ulong)uVar38;
    }
    uVar32 = 0;
    do {
      if (uVar29 == uVar32) {
        pcVar27 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
        goto LAB_0013ed45;
      }
      pIVar26 = (pIVar16->Windows).Data[uVar32];
      pIVar26->WasActive = pIVar26->Active;
      pIVar26->BeginCount = 0;
      pIVar26->Active = false;
      pIVar26->WriteAccessed = false;
      uVar32 = uVar32 + 1;
    } while (uVar38 != uVar32);
  }
  if ((pIVar16->NavWindow != (ImGuiWindow *)0x0) && (pIVar16->NavWindow->WasActive == false)) {
    FocusTopMostWindowUnderOne((ImGuiWindow *)0x0,(ImGuiWindow *)0x0);
  }
  iVar24 = (pIVar16->CurrentWindowStack).Capacity;
  if (iVar24 < 0) {
    uVar38 = iVar24 / 2 + iVar24;
    uVar29 = 0;
    if (0 < (int)uVar38) {
      uVar29 = (ulong)uVar38;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar6 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar6 = *piVar6 + 1;
    }
    __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar29 * 8,GImAllocatorUserData);
    ppIVar14 = (pIVar16->CurrentWindowStack).Data;
    if (ppIVar14 != (ImGuiWindow **)0x0) {
      memcpy(__dest,ppIVar14,(long)(pIVar16->CurrentWindowStack).Size << 3);
      ppIVar14 = (pIVar16->CurrentWindowStack).Data;
      if ((ppIVar14 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar6 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar6 = *piVar6 + -1;
      }
      (*GImAllocatorFreeFunc)(ppIVar14,GImAllocatorUserData);
    }
    (pIVar16->CurrentWindowStack).Data = __dest;
    (pIVar16->CurrentWindowStack).Capacity = (int)uVar29;
  }
  (pIVar16->CurrentWindowStack).Size = 0;
  iVar24 = (pIVar16->BeginPopupStack).Capacity;
  if (iVar24 < 0) {
    uVar38 = iVar24 / 2 + iVar24;
    uVar29 = 0;
    if (0 < (int)uVar38) {
      uVar29 = (ulong)uVar38;
    }
    if (GImGui != (ImGuiContext *)0x0) {
      piVar6 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar6 = *piVar6 + 1;
    }
    __dest_00 = (ImGuiPopupData *)(*GImAllocatorAllocFunc)(uVar29 * 0x30,GImAllocatorUserData);
    pIVar15 = (pIVar16->BeginPopupStack).Data;
    if (pIVar15 != (ImGuiPopupData *)0x0) {
      memcpy(__dest_00,pIVar15,(long)(pIVar16->BeginPopupStack).Size * 0x30);
      pIVar15 = (pIVar16->BeginPopupStack).Data;
      if ((pIVar15 != (ImGuiPopupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar6 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar6 = *piVar6 + -1;
      }
      (*GImAllocatorFreeFunc)(pIVar15,GImAllocatorUserData);
    }
    (pIVar16->BeginPopupStack).Data = __dest_00;
    (pIVar16->BeginPopupStack).Capacity = (int)uVar29;
  }
  (pIVar16->BeginPopupStack).Size = 0;
  ClosePopupsOverWindow(pIVar16->NavWindow,false);
  pIVar17 = GImGui;
  GImGui->DebugItemPickerBreakID = 0;
  if (pIVar17->DebugItemPickerActive == true) {
    uVar38 = pIVar17->HoveredIdPreviousFrame;
    pIVar17->MouseCursor = 7;
    iVar24 = (pIVar17->IO).KeyMap[0xe];
    if ((-1 < iVar24) && (bVar36 = IsKeyPressed(iVar24,true), bVar36)) {
      pIVar17->DebugItemPickerActive = false;
    }
    pIVar19 = GImGui;
    if (uVar38 != 0 && (GImGui->IO).MouseDownDuration[0] == 0.0) {
      pIVar17->DebugItemPickerBreakID = uVar38;
      pIVar17->DebugItemPickerActive = false;
    }
    pIVar7 = &pIVar19->NextWindowData;
    *(byte *)&pIVar7->Flags = (byte)pIVar7->Flags | 0x40;
    (pIVar19->NextWindowData).BgAlphaVal = 0.6;
    BeginTooltip();
    Text("HoveredId: 0x%08X",(ulong)uVar38);
    Text("Press ESC to abort picking.");
    TextColored((GImGui->Style).Colors + (uVar38 == 0),"Click to break in debugger!");
    EndTooltip();
  }
  pIVar17 = GImGui;
  (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
  (pIVar17->NextWindowData).SizeVal.x = 400.0;
  (pIVar17->NextWindowData).SizeVal.y = 400.0;
  (pIVar17->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  pIVar16->FrameScopePushedImplicitWindow = true;
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PreNewFrame(&g);
#endif

    // Check and assert for various common IO and Configuration mistakes
    NewFrameSanityChecks();

    // Load settings on first frame (if not explicitly loaded manually before)
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }

    g.Time += g.IO.DeltaTime;
    g.FrameScopeActive = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    g.BackgroundDrawList.Clear();
    g.BackgroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.BackgroundDrawList.PushClipRectFullScreen();

    g.ForegroundDrawList.Clear();
    g.ForegroundDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.ForegroundDrawList.PushClipRectFullScreen();

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    g.DrawData.Clear();

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputTextId != 0 && g.ActiveId != g.TempInputTextId)
        g.TempInputTextId = 0;

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSourceOrTarget = false;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Pressing TAB activate widget focus
    g.FocusTabPressed = (g.NavWindow && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab));
    if (g.ActiveId == 0 && g.FocusTabPressed)
    {
        // Note that SetKeyboardFocusHere() sets the Next fields mid-frame. To be consistent we also
        // manipulate the Next fields even, even though they will be turned into Curr fields by the code below.
        g.FocusRequestNextWindow = g.NavWindow;
        g.FocusRequestNextCounterAll = INT_MAX;
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.FocusRequestNextCounterTab = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.FocusRequestNextCounterTab = g.IO.KeyShift ? -1 : 0;
    }

    // Turn queued focus request into current one
    g.FocusRequestCurrWindow = NULL;
    g.FocusRequestCurrCounterAll = g.FocusRequestCurrCounterTab = INT_MAX;
    if (g.FocusRequestNextWindow != NULL)
    {
        ImGuiWindow* window = g.FocusRequestNextWindow;
        g.FocusRequestCurrWindow = window;
        if (g.FocusRequestNextCounterAll != INT_MAX && window->DC.FocusCounterAll != -1)
            g.FocusRequestCurrCounterAll = ImModPositive(g.FocusRequestNextCounterAll, window->DC.FocusCounterAll + 1);
        if (g.FocusRequestNextCounterTab != INT_MAX && window->DC.FocusCounterTab != -1)
            g.FocusRequestCurrCounterTab = ImModPositive(g.FocusRequestNextCounterTab, window->DC.FocusCounterTab + 1);
        g.FocusRequestNextWindow = NULL;
        g.FocusRequestNextCounterAll = g.FocusRequestNextCounterTab = INT_MAX;
    }

    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    g.FrameScopePushedImplicitWindow = true;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    ImGuiTestEngineHook_PostNewFrame(&g);
#endif
}